

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::clear_node::test_method(clear_node *this)

{
  undefined8 uVar1;
  bool bVar2;
  node_type *pnVar3;
  node_type *pnVar4;
  lazy_ostream *plVar5;
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  *pnVar6;
  const_bf_iterator *pcVar7;
  pointer this_00;
  data_type *pdVar8;
  size_type sVar9;
  basic_cstring<const_char> local_f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_f60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
  local_f40;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
  local_f20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_f00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_ee0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_ec0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  assertion_result local_e60;
  basic_cstring<const_char> local_e48;
  basic_cstring<const_char> local_e38;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_e28;
  const_bf_iterator local_dd0;
  const_bf_iterator local_d78;
  const_bf_iterator local_d20;
  stringstream local_cc8 [8];
  stringstream tst_2;
  ostream local_cb8 [376];
  basic_cstring<const_char> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_b10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_af0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_ad0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_ab0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_a90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  assertion_result local_a10;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_9d8;
  const_bf_iterator local_980;
  const_bf_iterator local_928;
  const_bf_iterator local_8d0;
  stringstream local_878 [8];
  stringstream tst_1;
  ostream local_868 [376];
  basic_cstring<const_char> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_6c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_6a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_660;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_640;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  assertion_result local_5c0;
  basic_cstring<const_char> local_5a8;
  basic_cstring<const_char> local_598;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_588;
  const_bf_iterator local_530;
  const_bf_iterator local_4d8;
  const_bf_iterator local_480;
  stringstream local_428 [8];
  stringstream tst;
  ostream local_418 [380];
  undefined4 local_29c;
  size_type local_298;
  basic_cstring<const_char> local_290;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_280;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  undefined4 local_234;
  size_type local_230;
  basic_cstring<const_char> local_228;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_218;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  undefined4 local_1cc;
  size_type local_1c8;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1b0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  undefined4 local_164;
  size_type local_160;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_148;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  data_type local_fc;
  iterator local_f8;
  data_type local_dc;
  iterator local_d8;
  data_type local_bc;
  iterator local_b8;
  data_type local_9c;
  iterator local_98;
  data_type local_7c;
  iterator local_78;
  data_type local_5c;
  iterator local_58;
  data_type local_2c;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  clear_node *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  local_2c = 2;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28,
             &local_2c);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_5c = 3;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_58,pnVar3,&local_5c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_58);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_7c = 5;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_78,pnVar3,&local_7c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_78);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,0);
  local_9c = 7;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_98,pnVar4,&local_9c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_98);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,1);
  local_bc = 0xd;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_b8,pnVar4,&local_bc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_b8);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,0);
  local_dc = 0xb;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_d8,pnVar4,&local_dc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_d8);
  pnVar3 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar4 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar3,1);
  local_fc = 0x11;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_f8,pnVar4,&local_fc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_f8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_120);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_110,0x1b7,&local_120);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_148,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_160 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_164 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_148,&local_158,0x1b7,1,2,&local_160,"t1.size()",&local_164,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x1b8,&local_188);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1b0,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_1c8 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_1cc = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1b0,&local_1c0,0x1b8,1,2,&local_1c8,"t1.depth()",&local_1cc,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pnVar6 = &st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28)->
            super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ;
  st_tree::detail::
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ::clear(pnVar6);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e0,0x1bb,&local_1f0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_218,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_230 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::size
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_234 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_218,&local_228,0x1bb,1,2,&local_230,"t1.size()",&local_234,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_218);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_258);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x1bc,&local_258);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_280,plVar5,(char (*) [1])0x4059bc);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    local_298 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::depth
                          ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                           local_28);
    local_29c = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_280,&local_290,0x1bc,1,2,&local_298,"t1.depth()",&local_29c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_280);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::stringstream(local_428);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_480,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_480);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_480);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4d8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_4d8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4d8);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_530,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_530);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_530);
    if (bVar2) {
      std::operator<<(local_418," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    this_00 = st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7);
    pdVar8 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(this_00);
    std::ostream::operator<<(local_418,*pdVar8);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_588,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_588);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_598,0x1be,&local_5a8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_5e0,"2");
    boost::test_tools::assertion_result::assertion_result(&local_5c0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6c0,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_6a0,&local_6c0,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_680,&local_6a0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_660,&local_680,(char (*) [2])0x405dd2);
    boost::unit_test::operator<<(&local_640,&local_660,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_620,&local_640,&local_6e0);
    boost::unit_test::operator<<(&local_600,&local_620,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_5c0,&local_600,&local_6f0,0x1be,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_600);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_620);
    std::__cxx11::string::~string((string *)&local_6e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_640);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_660);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_680);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_6a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_6c0);
    boost::test_tools::assertion_result::~assertion_result(&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_428);
  std::__cxx11::stringstream::stringstream(local_878);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_8d0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_8d0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_8d0);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_928,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_928);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_928);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_980,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_980);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_980);
    if (bVar2) {
      std::operator<<(local_868," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar6 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::ply(pnVar6);
    std::ostream::operator<<(local_868,sVar9);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_9d8,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_9d8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e8,0x1bf,&local_9f8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_a30,"0");
    boost::test_tools::assertion_result::assertion_result(&local_a10,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b10,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_af0,&local_b10,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_ad0,&local_af0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_ab0,&local_ad0,(char (*) [2])0x40ef4e);
    boost::unit_test::operator<<(&local_a90,&local_ab0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_a70,&local_a90,&local_b30);
    boost::unit_test::operator<<(&local_a50,&local_a70,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b40,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_a10,&local_a50,&local_b40,0x1bf,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_a50);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_a70);
    std::__cxx11::string::~string((string *)&local_b30);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_a90);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_ab0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_ad0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_af0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_b10);
    boost::test_tools::assertion_result::~assertion_result(&local_a10);
    std::__cxx11::string::~string((string *)&local_a30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_878);
  std::__cxx11::stringstream::stringstream(local_cc8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_d20,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar7,&local_d20);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_d20);
  while( true ) {
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_d78,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_d78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_d78);
    if (!bVar2) break;
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_dd0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar7,&local_dd0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_dd0);
    if (bVar2) {
      std::operator<<(local_cb8," ");
    }
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar6 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar7)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar9 = st_tree::detail::
            node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
            ::subtree_size(pnVar6);
    std::ostream::operator<<(local_cb8,sVar9);
    pcVar7 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_e28,pcVar7);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_e28);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e38,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e38,0x1c0,&local_e48);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_e80,"1");
    boost::test_tools::assertion_result::assertion_result(&local_e60,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f60,plVar5,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_f40,&local_f60,(char (*) [15])"subtree_size()");
    boost::unit_test::operator<<(&local_f20,&local_f40,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_f00,&local_f20,(char (*) [2])0x40ef5b);
    boost::unit_test::operator<<(&local_ee0,&local_f00,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_ec0,&local_ee0,&local_f80);
    boost::unit_test::operator<<(&local_ea0,&local_ec0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f90,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_e60,&local_ea0,&local_f90,0x1c0,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_ea0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_ec0);
    std::__cxx11::string::~string((string *)&local_f80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_ee0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_f00);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_f20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[15],_const_char_(&)[15]>
    ::~lazy_ostream_impl(&local_f40);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_f60);
    boost::test_tools::assertion_result::~assertion_result(&local_e60);
    std::__cxx11::string::~string((string *)&local_e80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_cc8);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(clear_node) {
    tree<int> t1;
    t1.insert(2);
    t1.root().insert(3);
    t1.root().insert(5);
    t1.root()[0].insert(7);
    t1.root()[1].insert(13);
    t1.root()[0].insert(11);
    t1.root()[1].insert(17);
    BOOST_CHECK_EQUAL(t1.size(), 7);
    BOOST_CHECK_EQUAL(t1.depth(), 3);

    t1.root().clear();
    BOOST_CHECK_EQUAL(t1.size(), 1);
    BOOST_CHECK_EQUAL(t1.depth(), 1);

    CHECK_TREE(t1, data(), "2");
    CHECK_TREE(t1, ply(), "0");
    CHECK_TREE(t1, subtree_size(), "1");
}